

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::Writer::initializeLogger(Writer *this,string *loggerId,bool lookup,bool needLock)

{
  RegisteredLoggers *pRVar1;
  bool bVar2;
  Logger *pLVar3;
  Writer *pWVar4;
  undefined7 in_register_00000011;
  Level level;
  allocator local_91;
  undefined1 local_90 [32];
  char *local_70;
  VerboseLevel local_68;
  Logger *local_60;
  bool local_58;
  Logger *local_50;
  char *local_48;
  DispatchAction local_40;
  pointer local_38;
  pointer pbStack_30;
  pointer local_28;
  
  if ((int)CONCAT71(in_register_00000011,lookup) == 0) {
    pLVar3 = this->m_logger;
  }
  else {
    pLVar3 = RegisteredLoggers::get
                       ((RegisteredLoggers *)elStorage[3],loggerId,
                        (bool)((byte)((ushort)(short)elStorage[4] >> 0xc) & 1));
    this->m_logger = pLVar3;
  }
  if (pLVar3 == (Logger *)0x0) {
    (**(code **)*elStorage)();
    pRVar1 = (RegisteredLoggers *)elStorage[3];
    std::__cxx11::string::string((string *)local_90,"default",&local_91);
    bVar2 = RegisteredLoggers::has(pRVar1,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    if (!bVar2) {
      pRVar1 = (RegisteredLoggers *)elStorage[3];
      std::__cxx11::string::string((string *)local_90,"default",&local_91);
      RegisteredLoggers::get(pRVar1,(string *)local_90,true);
      std::__cxx11::string::~string((string *)local_90);
    }
    (**(code **)(*elStorage + 8))();
    local_90._16_8_ = this->m_file;
    local_90._24_8_ = this->m_line;
    local_70 = this->m_func;
    local_90._0_8_ = &PTR__Writer_00176078;
    local_90._8_2_ = Debug;
    local_68 = 0;
    local_60 = (Logger *)0x0;
    local_58 = false;
    local_50 = (Logger *)0x0;
    local_48 = "";
    local_40 = NormalLog;
    local_38 = (pointer)0x0;
    pbStack_30 = (pointer)0x0;
    local_28 = (pointer)0x0;
    pWVar4 = construct((Writer *)local_90,1,"default");
    pWVar4 = operator<<(pWVar4,(char (*) [9])"Logger [");
    pWVar4 = operator<<(pWVar4,loggerId);
    operator<<(pWVar4,(char (*) [25])"] is not registered yet!");
    ~Writer((Writer *)local_90);
    this->m_proceed = false;
    return;
  }
  if (needLock) {
    (**(pLVar3->super_ThreadSafe)._vptr_ThreadSafe)(pLVar3);
  }
  if ((*(byte *)((long)elStorage + 0x21) & 8) == 0) {
    pLVar3 = this->m_logger;
    level = this->m_level;
  }
  else {
    if (this->m_level != Verbose) {
      bVar2 = *(Level *)(elStorage + 0x25) <= this->m_level;
      goto LAB_0014bf7f;
    }
    pLVar3 = this->m_logger;
    level = Verbose;
  }
  bVar2 = Logger::enabled(pLVar3,level);
LAB_0014bf7f:
  this->m_proceed = bVar2;
  return;
}

Assistant:

void initializeLogger(const std::string& loggerId, bool lookup = true, bool needLock = true) {
    if (lookup) {
      m_logger = ELPP->registeredLoggers()->get(loggerId, ELPP->hasFlag(LoggingFlag::CreateLoggerAutomatically));
    }
    if (m_logger == nullptr) {
      ELPP->acquireLock();
      if (!ELPP->registeredLoggers()->has(std::string(base::consts::kDefaultLoggerId))) {
        // Somehow default logger has been unregistered. Not good! Register again
        ELPP->registeredLoggers()->get(std::string(base::consts::kDefaultLoggerId));
      }
      ELPP->releaseLock();  // Need to unlock it for next writer
      Writer(Level::Debug, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
          << "Logger [" << loggerId << "] is not registered yet!";
      m_proceed = false;
    } else {
      if (needLock) {
        m_logger->acquireLock();  // This should not be unlocked by checking m_proceed because
        // m_proceed can be changed by lines below
      }
      if (ELPP->hasFlag(LoggingFlag::HierarchicalLogging)) {
        m_proceed = m_level == Level::Verbose ? m_logger->enabled(m_level) :
                    LevelHelper::castToInt(m_level) >= LevelHelper::castToInt(ELPP->m_loggingLevel);
      } else {
        m_proceed = m_logger->enabled(m_level);
      }
    }
  }